

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1933e1::ConvolveScale2DTest_DISABLED_Speed_Test::TestBody
          (ConvolveScale2DTest_DISABLED_Speed_Test *this)

{
  ulong uVar1;
  long in_RDI;
  int elapsed_time;
  int n;
  aom_usec_timer timer;
  int step;
  int frac;
  int height;
  int width;
  int kNumTests;
  InterpKernel *filter;
  uint8_t *out;
  uint8_t *in;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_5c;
  aom_usec_timer local_58;
  undefined4 local_34;
  undefined4 local_30;
  uint local_2c;
  uint local_28;
  undefined4 local_24;
  int16_t *local_20;
  uint8_t *local_18;
  uint8_t *local_10;
  
  local_10 = ConvolveScale2DTest::input
                       ((ConvolveScale2DTest *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  local_18 = ConvolveScale2DTest::output
                       ((ConvolveScale2DTest *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  local_20 = av1_get_interp_filter_kernel(EIGHTTAP_REGULAR,3);
  local_24 = 10000;
  local_28 = ConvolveScale2DTest::Width((ConvolveScale2DTest *)0x44e17e);
  local_2c = ConvolveScale2DTest::Height((ConvolveScale2DTest *)0x44e18c);
  local_30 = 8;
  local_34 = 0x10;
  ::aom_usec_timer_start((aom_usec_timer *)0x44e1aa);
  for (local_5c = 0; local_5c < 10000; local_5c = local_5c + 1) {
    (**(code **)(in_RDI + 0x18))
              (local_10,0x200,local_18,0x200,local_20,8,0x10,8,0x10,local_28,local_2c);
  }
  ::aom_usec_timer_mark((aom_usec_timer *)0x44e22c);
  uVar1 = ::aom_usec_timer_elapsed(&local_58);
  printf("convolve_scale_2d_%dx%d_%d: %d us\n",(ulong)local_28,(ulong)local_2c,8,uVar1 & 0xffffffff)
  ;
  return;
}

Assistant:

TEST_P(ConvolveScale2DTest, DISABLED_Speed) {
  const uint8_t *const in = input();
  uint8_t *const out = output();
  const InterpKernel *const filter =
      (const InterpKernel *)av1_get_interp_filter_kernel(EIGHTTAP_REGULAR,
                                                         USE_8_TAPS);
  const int kNumTests = 10000;
  const int width = Width();
  const int height = Height();
  const int frac = 8;
  const int step = 16;
  aom_usec_timer timer;

  aom_usec_timer_start(&timer);
  for (int n = 0; n < kNumTests; ++n) {
    test_func_(in, kInputStride, out, kOutputStride, filter, frac, step, frac,
               step, width, height);
  }
  aom_usec_timer_mark(&timer);

  const int elapsed_time = static_cast<int>(aom_usec_timer_elapsed(&timer));
  printf("convolve_scale_2d_%dx%d_%d: %d us\n", width, height, 8, elapsed_time);
}